

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O1

string * __thiscall
absl::lts_20240722::flags_internal::Unparse_abi_cxx11_
          (string *__return_storage_ptr__,flags_internal *this,short v)

{
  undefined8 uVar1;
  char local_30 [32];
  
  uVar1 = absl::lts_20240722::numbers_internal::FastIntToBuffer((int)this,local_30);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,local_30,uVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Unparse(short v) { return absl::StrCat(v); }